

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  Tokenizer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  _Alloc_hider _Var6;
  string field_name;
  string local_68;
  string local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"[","");
  bVar4 = TryConsume(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    bVar4 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar4) {
      return false;
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"]","");
    bVar4 = ConsumeBeforeWhitespace(this,&local_68);
  }
  else {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    bVar4 = ConsumeIdentifierBeforeWhitespace(this,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4 == false) {
    return false;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Unknown/Reserved","");
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_WHITESPACE) {
    io::Tokenizer::Next(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,":","");
  bVar4 = TryConsumeBeforeWhitespace(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Unknown/Reserved","");
    if ((this_00->current_).type == TYPE_WHITESPACE) {
      io::Tokenizer::Next(this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
    _Var6._M_p = local_68._M_dataplus._M_p;
    sVar2 = (this->tokenizer_).current_.text._M_string_length;
    if ((sVar2 == local_68._M_string_length) &&
       ((sVar2 == 0 ||
        (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_68._M_dataplus._M_p,
                      sVar2), iVar5 == 0)))) {
      bVar4 = false;
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<","");
      _Var3._M_p = local_48._M_dataplus._M_p;
      sVar2 = (this->tokenizer_).current_.text._M_string_length;
      if (sVar2 == local_48._M_string_length) {
        if (sVar2 == 0) {
          bVar4 = false;
        }
        else {
          iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_48._M_dataplus._M_p,
                       sVar2);
          bVar4 = iVar5 != 0;
        }
      }
      else {
        bVar4 = true;
      }
      _Var6._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_48.field_2) {
        operator_delete(_Var3._M_p);
        _Var6._M_p = local_68._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar1) {
      operator_delete(_Var6._M_p);
    }
    if (bVar4) {
      bVar4 = SkipFieldValue(this);
      goto LAB_003b6b8d;
    }
  }
  bVar4 = SkipFieldMessage(this);
LAB_003b6b8d:
  if (bVar4 == false) {
    return false;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,";","");
  bVar4 = TryConsume(this,&local_68);
  if (!bVar4) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,",","");
    TryConsume(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace("Unknown/Reserved", "n/a");

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace("Unknown/Reserved", "n/a");
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }